

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrema.c
# Opt level: O1

size_t find_minimum(uint8_t *array,size_t length)

{
  size_t sVar1;
  byte bVar2;
  size_t sVar3;
  
  if (length == 0) {
    return 0;
  }
  bVar2 = 0xff;
  sVar3 = 0;
  sVar1 = 0;
  do {
    if (array[sVar3] < bVar2) {
      bVar2 = array[sVar3];
      sVar1 = sVar3;
    }
    sVar3 = sVar3 + 1;
  } while (length != sVar3);
  return sVar1;
}

Assistant:

size_t find_minimum(const uint8_t* array, const size_t length) {
  size_t res = 0;
  uint8_t min = 255;
  for (size_t n = 0; n < length; n++) {
    if (array[n] < min) {
      min = array[n];
      res = n;
    }
  }
  return res;
}